

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++:195:45)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_io_c__:195:45)>
      *this)

{
  BufferedOutputStreamWrapper *pBVar1;
  
  pBVar1 = (this->func).this;
  if ((pBVar1->buffer).ptr < pBVar1->bufferPos) {
    (*pBVar1->inner->_vptr_OutputStream[2])();
    pBVar1->bufferPos = (pBVar1->buffer).ptr;
  }
  return;
}

Assistant:

void run() override {
    func();
  }